

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  int iVar1;
  _Elt_pointer ppVVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ValueHolder VVar6;
  uint uVar7;
  Char buffer [33];
  double value;
  ValueHolder local_a8;
  long local_a0;
  size_type local_98;
  long lStack_90;
  double local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ValueHolder local_50 [2];
  size_type local_40 [2];
  
  local_78 = 0.0;
  uVar7 = (int)token->end_ - (int)token->start_;
  if ((int)uVar7 < 0) {
    local_a8.string_ = (char *)&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Unable to parse token length","");
    addError(this,(string *)&local_a8,token,(Location)0x0);
    local_40[0] = local_98;
    VVar6 = local_a8;
    if (local_a8 == &local_98) {
      return false;
    }
  }
  else {
    if ((int)uVar7 < 0x21) {
      memcpy(&local_a8,token->start_,(ulong)(uVar7 & 0x7fffffff));
      *(undefined1 *)((long)&local_a8 + (ulong)(uVar7 & 0x7fffffff)) = 0;
      iVar1 = __isoc99_sscanf(&local_a8,&DAT_001afea3,&local_78);
    }
    else {
      local_a8.string_ = (char *)&local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8);
      iVar1 = __isoc99_sscanf(local_a8.int_,&DAT_001afea3,&local_78);
      if (local_a8 != &local_98) {
        operator_delete(local_a8.string_,local_98 + 1);
      }
    }
    if (iVar1 == 1) {
      Value::Value((Value *)&local_a8,local_78);
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar2 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      Value::operator=(ppVVar2[-1],(Value *)&local_a8);
      Value::~Value((Value *)&local_a8);
      return true;
    }
    local_50[0].string_ = (char *)local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,token->start_,token->end_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1afe71);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      local_98 = *psVar5;
      lStack_90 = plVar3[3];
      local_a8.string_ = (char *)&local_98;
    }
    else {
      local_98 = *psVar5;
      local_a8.string_ = ((char *)*plVar3).string_;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    addError(this,(string *)&local_a8,token,(Location)0x0);
    if (local_a8 != &local_98) {
      operator_delete(local_a8.string_,local_98 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    VVar6 = local_50[0];
    if (local_50[0] == local_40) {
      return false;
    }
  }
  operator_delete(VVar6.string_,local_40[0] + 1);
  return false;
}

Assistant:

bool 
Reader::decodeDouble( Token &token )
{
   double value = 0;
   const int bufferSize = 32;
   int count;
   int length = int(token.end_ - token.start_);

   // Sanity check to avoid buffer overflow exploits.
   if (length < 0) {
      return addError( "Unable to parse token length", token );
   }

   // Avoid using a string constant for the format control string given to
   // sscanf, as this can cause hard to debug crashes on OS X. See here for more
   // info:
   //
   //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
   char format[] = "%lf";

   if ( length <= bufferSize )
   {
      Char buffer[bufferSize+1];
      memcpy( buffer, token.start_, length );
      buffer[length] = 0;
      count = sscanf( buffer, format, &value );
   }
   else
   {
      std::string buffer( token.start_, token.end_ );
      count = sscanf( buffer.c_str(), format, &value );
   }

   if ( count != 1 )
      return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
   currentValue() = value;
   return true;
}